

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFPSCounter.cpp
# Opt level: O0

void __thiscall
irr::video::CFPSCounter::registerFrame(CFPSCounter *this,u32 now,u32 primitivesDrawn)

{
  s32 sVar1;
  int in_EDX;
  int in_ESI;
  s32 *in_RDI;
  f32 invMilli;
  u32 milliseconds;
  
  in_RDI[3] = in_RDI[3] + 1;
  in_RDI[6] = in_EDX + in_RDI[6];
  in_RDI[4] = in_EDX + in_RDI[4];
  in_RDI[1] = in_EDX;
  if (0x5db < (uint)(in_ESI - in_RDI[2])) {
    core::reciprocal((f32)(float)(uint)(in_ESI - in_RDI[2]));
    sVar1 = core::ceil32(0.0);
    *in_RDI = sVar1;
    sVar1 = core::ceil32(0.0);
    in_RDI[5] = sVar1;
    in_RDI[3] = 0;
    in_RDI[4] = 0;
    in_RDI[2] = in_ESI;
  }
  return;
}

Assistant:

void CFPSCounter::registerFrame(u32 now, u32 primitivesDrawn)
{
	++FramesCounted;
	PrimitiveTotal += primitivesDrawn;
	PrimitivesCounted += primitivesDrawn;
	Primitive = primitivesDrawn;

	const u32 milliseconds = now - StartTime;

	if (milliseconds >= 1500) {
		const f32 invMilli = core::reciprocal((f32)milliseconds);

		FPS = core::ceil32((1000 * FramesCounted) * invMilli);
		PrimitiveAverage = core::ceil32((1000 * PrimitivesCounted) * invMilli);

		FramesCounted = 0;
		PrimitivesCounted = 0;
		StartTime = now;
	}
}